

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

LoopLabels * push_ir_loop(Context_conflict *ctx,int isswitch)

{
  LoopLabels *pLVar1;
  int iVar2;
  
  pLVar1 = (LoopLabels *)Malloc(ctx,0x10);
  if (pLVar1 != (LoopLabels *)0x0) {
    iVar2 = ctx->ir_label_count + (uint)(isswitch == 0);
    pLVar1->start = -(uint)(isswitch != 0) | ctx->ir_label_count;
    ctx->ir_label_count = iVar2 + 1;
    pLVar1->end = iVar2;
    pLVar1->prev = ctx->ir_loop;
    ctx->ir_loop = pLVar1;
  }
  return pLVar1;
}

Assistant:

static const LoopLabels *push_ir_loop(Context *ctx, const int isswitch)
{
    // !!! FIXME: cache these allocations?
    LoopLabels *retval = Malloc(ctx, sizeof (LoopLabels));
    if (retval)
    {
        retval->start = (isswitch) ? -1 : generate_ir_label(ctx);
        retval->end = generate_ir_label(ctx);
        retval->prev = ctx->ir_loop;
        ctx->ir_loop = retval;
    } // if

    return retval;
}